

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aspif_text.cpp
# Opt level: O0

void __thiscall Potassco::AspifTextOutput::endStep(AspifTextOutput *this)

{
  AspifTextOutput *in_RDI;
  TheoryData *unaff_retaddr;
  AspifTextOutput *in_stack_00000070;
  AspifTextOutput *in_stack_000001d0;
  uint32_t in_stack_ffffffffffffffbc;
  vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*>_>
  *in_stack_ffffffffffffffc8;
  vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*>_>
  *in_stack_ffffffffffffffd0;
  undefined1 local_20 [32];
  
  visitTheories(in_stack_00000070);
  push(in_RDI,in_stack_ffffffffffffffbc);
  writeDirectives(in_stack_000001d0);
  memset(local_20,0,0x18);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x1124a9);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::swap
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffffd0,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffffc8);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffffd0);
  memset(&stack0xffffffffffffffc8,0,0x18);
  std::
  vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*>_>
  ::vector((vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*>_>
            *)0x1124e1);
  std::
  vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*>_>
  ::swap(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  std::
  vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*>_>
  ::~vector(in_stack_ffffffffffffffd0);
  if (in_RDI->step_ < 0) {
    TheoryData::reset(unaff_retaddr);
  }
  return;
}

Assistant:

void AspifTextOutput::endStep() {
	visitTheories();
	push(Directive_t::End);
	writeDirectives();
	Data::RawVec().swap(data_->directives);
	Data::OutOrder().swap(data_->out);
	if (step_ < 0) { theory_.reset();  }
}